

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O1

void __thiscall KeyPair::MakeKeyPairData(KeyPair *this)

{
  uchar *puVar1;
  _Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false> t;
  pointer __p;
  _Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false> _Var2;
  long in_FS_OFFSET;
  array<unsigned_char,_96UL> *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_keypair)._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl ==
      (array<unsigned_char,_96UL> *)0x0) {
    _Var2._M_head_impl =
         secure_allocator<std::array<unsigned_char,_96UL>_>::allocate
                   ((secure_allocator<std::array<unsigned_char,_96UL>_> *)&local_20,1);
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x50);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x58);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x40);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x48);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x30);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x38);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x20);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x28);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x10);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 0x18);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(undefined8 *)(_Var2._M_head_impl)->_M_elems = 0;
    puVar1 = (uchar *)((long)(_Var2._M_head_impl)->_M_elems + 8);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    local_20 = (array<unsigned_char,_96UL> *)0x0;
    t._M_head_impl =
         (this->m_keypair)._M_t.
         super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl;
    (this->m_keypair)._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    if (t._M_head_impl != (array<unsigned_char,_96UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_96UL>_> *)this,t._M_head_impl);
    }
    if (local_20 != (array<unsigned_char,_96UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_96UL>_> *)&local_20,local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeKeyPairData()
    {
        if (!m_keypair) m_keypair = make_secure_unique<KeyType>();
    }